

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall icu_63::DateFormatSymbols::disposeZoneStrings(DateFormatSymbols *this)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  void *in_RSI;
  int local_18;
  int local_14;
  int32_t row_1;
  int32_t row;
  DateFormatSymbols *this_local;
  
  if (this->fZoneStrings != (UnicodeString **)0x0) {
    for (local_14 = 0; local_14 < this->fZoneStringsRowCount; local_14 = local_14 + 1) {
      pUVar1 = this->fZoneStrings[local_14];
      if (pUVar1 != (UnicodeString *)0x0) {
        pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        while (pUVar1 != pUVar2) {
          pUVar2 = pUVar2 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar2);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
      }
    }
    uprv_free_63(this->fZoneStrings);
  }
  if (this->fLocaleZoneStrings != (UnicodeString **)0x0) {
    for (local_18 = 0; local_18 < this->fZoneStringsRowCount; local_18 = local_18 + 1) {
      pUVar1 = this->fLocaleZoneStrings[local_18];
      if (pUVar1 != (UnicodeString *)0x0) {
        pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        while (pUVar1 != pUVar2) {
          pUVar2 = pUVar2 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar2);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
      }
    }
    uprv_free_63(this->fLocaleZoneStrings);
  }
  this->fZoneStrings = (UnicodeString **)0x0;
  this->fLocaleZoneStrings = (UnicodeString **)0x0;
  this->fZoneStringsRowCount = 0;
  this->fZoneStringsColCount = 0;
  return;
}

Assistant:

void DateFormatSymbols::disposeZoneStrings()
{
    if (fZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fZoneStrings[row];
        }
        uprv_free(fZoneStrings);
    }
    if (fLocaleZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fLocaleZoneStrings[row];
        }
        uprv_free(fLocaleZoneStrings);
    }

    fZoneStrings = NULL;
    fLocaleZoneStrings = NULL;
    fZoneStringsRowCount = 0;
    fZoneStringsColCount = 0;
}